

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_affinity.cpp
# Opt level: O0

void KMPAffinity::pick_api(void)

{
  KMPAffinity *this;
  KMPAffinity *affinity_dispatch;
  
  if (!picked_api) {
    this = (KMPAffinity *)operator_new(0x17edbc);
    memset(this,0,8);
    KMPNativeAffinity::KMPNativeAffinity((KMPNativeAffinity *)this);
    __kmp_affinity_dispatch = this;
    picked_api = true;
  }
  return;
}

Assistant:

void KMPAffinity::pick_api() {
  KMPAffinity *affinity_dispatch;
  if (picked_api)
    return;
#if KMP_USE_HWLOC
  // Only use Hwloc if affinity isn't explicitly disabled and
  // user requests Hwloc topology method
  if (__kmp_affinity_top_method == affinity_top_method_hwloc &&
      __kmp_affinity_type != affinity_disabled) {
    affinity_dispatch = new KMPHwlocAffinity();
  } else
#endif
  {
    affinity_dispatch = new KMPNativeAffinity();
  }
  __kmp_affinity_dispatch = affinity_dispatch;
  picked_api = true;
}